

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-quants.c
# Opt level: O2

void dequantize_row_tq1_0(block_tq1_0 *x,float *y,int64_t k)

{
  float fVar1;
  char cVar2;
  bool bVar3;
  byte bVar4;
  long lVar5;
  size_t n_1;
  long lVar6;
  uint8_t *puVar7;
  size_t m;
  long lVar8;
  size_t n;
  long lVar9;
  uint8_t *puVar10;
  size_t j;
  ulong uVar11;
  block_tq1_0 *pbVar12;
  
  lVar6 = 0;
  lVar5 = k / 0x100;
  if (k / 0x100 < 1) {
    lVar5 = lVar6;
  }
  puVar7 = x->qs + 0x20;
  pbVar12 = x;
  for (; lVar6 != lVar5; lVar6 = lVar6 + 1) {
    fVar1 = ggml_table_f32_f16[x[lVar6].d];
    bVar3 = true;
    while (bVar3) {
      for (lVar9 = 0; lVar9 != 5; lVar9 = lVar9 + 1) {
        cVar2 = (&DAT_0014f7f8)[lVar9];
        for (lVar8 = 0; lVar8 != 0x20; lVar8 = lVar8 + 1) {
          bVar4 = cVar2 * pbVar12->qs[lVar8];
          *y = (float)(int)(((uint)bVar4 + (uint)bVar4 * 2 >> 8) - 1) * fVar1;
          y = y + 1;
        }
      }
      bVar3 = false;
    }
    puVar10 = puVar7;
    for (uVar11 = 0x20; uVar11 < 0x30; uVar11 = uVar11 + 0x10) {
      for (lVar9 = 0; lVar9 != 5; lVar9 = lVar9 + 1) {
        cVar2 = (&DAT_0014f7f8)[lVar9];
        for (lVar8 = 0; lVar8 != 0x10; lVar8 = lVar8 + 1) {
          *y = (float)(int)(((uint)(byte)(cVar2 * puVar10[lVar8]) +
                             (uint)(byte)(cVar2 * puVar10[lVar8]) * 2 >> 8) - 1) * fVar1;
          y = y + 1;
        }
      }
      puVar10 = puVar10 + 0x10;
    }
    for (lVar9 = 0; lVar9 != 4; lVar9 = lVar9 + 1) {
      cVar2 = (&DAT_0014f7f8)[lVar9];
      for (lVar8 = 0x30; lVar8 != 0x34; lVar8 = lVar8 + 1) {
        bVar4 = cVar2 * pbVar12->qs[lVar8];
        *y = (float)(int)(((uint)bVar4 + (uint)bVar4 * 2 >> 8) - 1) * fVar1;
        y = y + 1;
      }
    }
    pbVar12 = pbVar12 + 1;
    puVar7 = puVar7 + 0x36;
  }
  return;
}

Assistant:

void dequantize_row_tq1_0(const block_tq1_0 * GGML_RESTRICT x, float * GGML_RESTRICT y, int64_t k) {
    assert(k % QK_K == 0);
    const int64_t nb = k / QK_K;

    const uint8_t pow3[6] = {1, 3, 9, 27, 81, 243};

    for (int64_t i = 0; i < nb; ++i) {

        const float d = GGML_FP16_TO_FP32(x[i].d);

        for (size_t j = 0; j < sizeof(x->qs) - sizeof(x->qs) % 32; j += 32) {
            for (size_t n = 0; n < 5; ++n) {
                for (size_t m = 0; m < 32; ++m) {
                    uint8_t q = x[i].qs[j + m] * pow3[n];
                    int16_t xi = ((uint16_t) q * 3) >> 8;
                    *y++ = (float) (xi - 1) * d;
                }
            }
        }
        for (size_t j = sizeof(x->qs) - sizeof(x->qs) % 32; j < sizeof(x->qs); j += 16) {
            for (size_t n = 0; n < 5; ++n) {
                for (size_t m = 0; m < 16; ++m) {
                    uint8_t q = x[i].qs[j + m] * pow3[n];
                    int16_t xi = ((uint16_t) q * 3) >> 8;
                    *y++ = (float) (xi - 1) * d;
                }
            }
        }

        for (size_t n = 0; n < 4; ++n) {
            for (size_t j = 0; j < sizeof(x->qh); ++j) {
                uint8_t q = x[i].qh[j] * pow3[n];
                int16_t xi = ((uint16_t) q * 3) >> 8;
                *y++ = (float) (xi - 1) * d;
            }
        }
    }
}